

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cRobustnessTests.cpp
# Opt level: O0

int __thiscall gl4cts::RobustnessTests::init(RobustnessTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  GetnUniformTest *this_00;
  ReadnPixelsTest *this_01;
  RobustnessTests *this_local;
  
  tcu::TestNode::init((TestNode *)this,ctx);
  pTVar1 = (TestNode *)operator_new(0x80);
  ResetNotificationStrategy::NoResetNotificationCase::NoResetNotificationCase
            ((NoResetNotificationCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "noResetNotification","Verifies if NO_RESET_NOTIFICATION strategy works as expected.");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x80);
  ResetNotificationStrategy::LoseContextOnResetCase::LoseContextOnResetCase
            ((LoseContextOnResetCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "loseContextOnReset","Verifies if LOSE_CONTEXT_ON_RESET strategy works as expected.");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  this_00 = (GetnUniformTest *)operator_new(0x90);
  RobustnessRobustBufferAccessBehavior::GetnUniformTest::GetnUniformTest
            (this_00,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  this_01 = (ReadnPixelsTest *)operator_new(0x80);
  RobustnessRobustBufferAccessBehavior::ReadnPixelsTest::ReadnPixelsTest
            (this_01,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
  return extraout_EAX;
}

Assistant:

void RobustnessTests::init()
{
	deqp::TestCaseGroup::init();

	try
	{
		addChild(new ResetNotificationStrategy::NoResetNotificationCase(
			m_context, "noResetNotification", "Verifies if NO_RESET_NOTIFICATION strategy works as expected."));
		addChild(new ResetNotificationStrategy::LoseContextOnResetCase(
			m_context, "loseContextOnReset", "Verifies if LOSE_CONTEXT_ON_RESET strategy works as expected."));

		addChild(new RobustnessRobustBufferAccessBehavior::GetnUniformTest(m_context));
		addChild(new RobustnessRobustBufferAccessBehavior::ReadnPixelsTest(m_context));
	}
	catch (...)
	{
		// Destroy context.
		deqp::TestCaseGroup::deinit();
		throw;
	}
}